

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O3

Option * docopt::Option::parse(Option *__return_storage_ptr__,string *option_description)

{
  long lVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  long *plVar6;
  undefined8 *puVar7;
  pointer psVar8;
  long lVar9;
  long *plVar10;
  long lVar11;
  string *this;
  char *pcVar12;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __b;
  pointer *ppbVar13;
  value val;
  string m;
  sregex_iterator i;
  string longOption;
  string shortOption;
  smatch match;
  Kind local_208;
  undefined1 local_200 [24];
  pointer psStack_1e8;
  undefined8 local_1e0;
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  undefined1 local_1b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  pointer psStack_198;
  pointer local_190;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  Option *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined1 local_110 [8];
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8;
  undefined7 uStack_d7;
  pointer psStack_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string *local_c0;
  string local_b8;
  string local_98;
  undefined1 local_78 [32];
  pointer local_58;
  pointer psStack_50;
  pointer local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_40;
  
  local_130 = &local_120;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  local_158 = &local_148;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_208 = Bool;
  local_200._0_8_ = local_200._0_8_ & 0xffffffffffffff00;
  local_138 = __return_storage_ptr__;
  sVar5 = std::__cxx11::string::find((char *)option_description,0x19ad69,0);
  if (sVar5 == 0xffffffffffffffff) {
    sVar5 = option_description->_M_string_length;
  }
  __b._M_current = (option_description->_M_dataplus)._M_p + sVar5;
  if ((parse(std::__cxx11::string_const&)::pattern_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_),
     iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,"(--|-)?(.*?)([,= ]|$)",0x10)
    ;
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse(std::__cxx11::string_const&)::pattern_abi_cxx11_);
  }
  local_c8._M_current = __b._M_current;
  local_c0 = option_description;
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)local_1b8,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(option_description->_M_dataplus)._M_p,__b,
                   &parse(std::__cxx11::string_const&)::pattern_abi_cxx11_,0x20);
  local_48 = (pointer)0x0;
  _Stack_40._M_current = (char *)0x0;
  local_58 = (pointer)0x0;
  psStack_50 = (pointer)0x0;
  local_78._16_8_ = (regex_type *)0x0;
  local_78._24_8_ = (char *)0x0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = (char *)0x0;
  local_1e0 = 0;
  while (bVar3 = std::__cxx11::
                 regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                 ::operator==((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                               *)local_1b8,
                              (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                               *)local_78), !bVar3) {
    lVar9 = (long)local_190 - (long)psStack_198;
    if (lVar9 == 0) {
      if (psStack_198[-3].matched != false) {
LAB_0017d8bd:
        if (*(long *)((long)psStack_198 + lVar9 + -0x40) -
            *(long *)((long)psStack_198 + lVar9 + -0x48) != 1) {
LAB_0017da18:
          psVar8 = (pointer)((long)psStack_198 + lVar9 + -0x48);
          goto LAB_0017da1f;
        }
LAB_0017d8d1:
        psVar8 = (pointer)((long)psStack_198 + lVar9 + -0x48);
LAB_0017d8d8:
        if (psVar8->matched == true) {
          local_178 = local_168;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_178,
                     (psVar8->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar8->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_170 = 0;
          local_168[0] = 0;
          local_178 = local_168;
        }
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x198877);
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_1c8 = *plVar10;
          lStack_1c0 = plVar6[3];
          local_1d8 = &local_1c8;
        }
        else {
          local_1c8 = *plVar10;
          local_1d8 = (long *)*plVar6;
        }
        local_1d0 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        this = (string *)&local_130;
LAB_0017dabd:
        std::__cxx11::string::operator=(this,(string *)&local_1d8);
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8);
        }
        if (local_178 != local_168) {
          operator_delete(local_178);
        }
      }
    }
    else {
      lVar11 = (lVar9 >> 3) * -0x5555555555555555;
      if (lVar11 - 5U < 0xfffffffffffffffe) {
        if (psStack_198[1].matched != false) {
          if ((psStack_198[1].matched == true) &&
             ((long)psStack_198[1].
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .second._M_current -
              (long)psStack_198[1].
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .first._M_current == 1)) {
            if (0xfffffffffffffffc < lVar11 - 6U) goto LAB_0017d8d1;
            psVar8 = psStack_198 + 2;
            goto LAB_0017d8d8;
          }
          if (0xfffffffffffffffc < lVar11 - 6U) goto LAB_0017da18;
          psVar8 = psStack_198 + 2;
LAB_0017da1f:
          if (psVar8->matched == true) {
            local_178 = local_168;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_178,
                       (psVar8->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).first._M_current,
                       (psVar8->
                       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).second._M_current);
          }
          else {
            local_170 = 0;
            local_168[0] = 0;
            local_178 = local_168;
          }
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x198876);
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_1c8 = *plVar6;
            lStack_1c0 = puVar7[3];
            local_1d8 = &local_1c8;
          }
          else {
            local_1c8 = *plVar6;
            local_1d8 = (long *)*puVar7;
          }
          local_1d0 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          this = (string *)&local_158;
          goto LAB_0017dabd;
        }
        if (0xfffffffffffffffc < lVar11 - 6U) goto LAB_0017d929;
        if ((psStack_198[2].matched != true) ||
           ((long)psStack_198[2].
                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .second._M_current -
            (long)psStack_198[2].
                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .first._M_current < 1)) goto LAB_0017dae8;
        psVar8 = psStack_198 + 2;
      }
      else {
        if (*(char *)((long)psStack_198 + lVar9 + -0x38) != '\0') {
          if (*(char *)((long)psStack_198 + lVar9 + -0x38) == '\x01') goto LAB_0017d8bd;
          goto LAB_0017da18;
        }
LAB_0017d929:
        if ((*(char *)((long)psStack_198 + lVar9 + -0x38) != '\x01') ||
           (lVar11 = *(long *)((long)psStack_198 + lVar9 + -0x40),
           lVar1 = *(long *)((long)psStack_198 + lVar9 + -0x48),
           lVar11 == lVar1 || lVar11 - lVar1 < 0)) goto LAB_0017dae8;
        psVar8 = (pointer)((long)psStack_198 + lVar9 + -0x48);
      }
      if ((psVar8->matched == true) &&
         (local_1d8 = &local_1c8,
         std::__cxx11::string::
         _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   ((string *)&local_1d8,
                    (psVar8->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).first._M_current,
                    (psVar8->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).second._M_current), local_1d8 != &local_1c8)) {
        operator_delete(local_1d8);
      }
      local_1e0 = 1;
    }
LAB_0017dae8:
    lVar9 = (long)local_190 - (long)psStack_198;
    if ((lVar9 == 0) || (0xfffffffffffffffb < (lVar9 >> 3) * -0x5555555555555555 - 7U)) {
      psVar8 = (pointer)((long)psStack_198 + lVar9 + -0x48);
    }
    else {
      psVar8 = psStack_198 + 3;
    }
    if ((psVar8->matched != true) ||
       ((psVar8->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).second._M_current ==
        (psVar8->
        super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ).first._M_current)) break;
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_1b8);
  }
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58);
  }
  if (psStack_198 != (pointer)0x0) {
    operator_delete(psStack_198);
  }
  if ((int)local_1e0 == 0) goto LAB_0017ddbc;
  local_78._16_8_ = (regex_type *)0x0;
  local_78._24_8_ = (char *)0x0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = (char *)0x0;
  pcVar2 = (local_c0->_M_dataplus)._M_p;
  sVar5 = local_c0->_M_string_length;
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,"\\[default: (.*)\\]"
             ,1);
  bVar3 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                    (local_c8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               )(pcVar2 + sVar5),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_78,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8,0
                    );
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_1b8);
  if (bVar3) {
    lVar9 = local_78._8_8_ - local_78._0_8_;
    if ((lVar9 == 0) || (0xfffffffffffffffd < (lVar9 >> 3) * -0x5555555555555555 - 5U)) {
      pcVar12 = (char *)(local_78._0_8_ + lVar9 + -0x48);
    }
    else {
      pcVar12 = (char *)(local_78._0_8_ + 0x18);
    }
    if (pcVar12[0x10] == '\x01') {
      local_e8._M_allocated_capacity = (size_type)&local_d8;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_e8,*(undefined8 *)pcVar12,*(undefined8 *)(pcVar12 + 8));
      if ((undefined1 *)local_e8._M_allocated_capacity == &local_d8) goto LAB_0017dc8c;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._M_allocated_capacity;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_d7,local_d8);
    }
    else {
      local_e8._8_8_ = (element_type *)0x0;
      local_d8 = 0;
LAB_0017dc8c:
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&local_1b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_d7,local_d8);
      psStack_198 = psStack_d0;
    }
    local_1b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._8_8_;
    ppbVar13 = &local_1b0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_d8 = 0;
    local_e8._8_8_ = (element_type *)0x0;
    local_1b8._0_4_ = 3;
    local_208 = String;
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    switch(0x17dd18) {
    case 0:
      local_200[0] = local_1b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_1_;
      break;
    case 1:
      local_200._0_8_ =
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      break;
    case 2:
      local_200._0_8_ = local_200 + 0x10;
      if (local_1b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)ppbVar13) {
        psStack_1e8 = psStack_198;
      }
      else {
        local_200._0_8_ =
             local_1b0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      local_200._16_8_ =
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_200._8_8_ =
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)local_1b0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar13;
      break;
    case 3:
      local_200._0_8_ =
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_200._8_8_ =
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_200._16_8_ =
           local_1b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
    }
    if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity);
    }
  }
  if ((char *)local_78._0_8_ != (char *)0x0) {
    operator_delete((void *)local_78._0_8_);
  }
LAB_0017ddbc:
  if (local_130 == &local_120) {
    local_98.field_2._8_8_ = local_120._8_8_;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_130;
  }
  local_98.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
  local_98.field_2._M_local_buf[0] = local_120._M_local_buf[0];
  local_98._M_string_length = local_128;
  local_128 = 0;
  local_120._M_local_buf[0] = '\0';
  if (local_158 == &local_148) {
    local_b8.field_2._8_8_ = local_148._8_8_;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)local_158;
  }
  local_b8.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_b8.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_b8._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  local_110._0_4_ = local_208;
  switch(local_208) {
  case Bool:
    local_108[0] = local_200[0];
    break;
  case Long:
    local_108._0_8_ = local_200._0_8_;
    break;
  case String:
    local_108._0_8_ = local_108 + 0x10;
    if ((pointer)local_200._0_8_ == (pointer)(local_200 + 0x10)) {
      local_108._24_8_ = psStack_1e8;
    }
    else {
      local_108._0_8_ = local_200._0_8_;
    }
    local_108._16_8_ = local_200._16_8_;
    local_108._8_8_ = local_200._8_8_;
    local_200._8_8_ = (element_type *)0x0;
    local_200._16_8_ = local_200._16_8_ & 0xffffffffffffff00;
    local_200._0_8_ = (pointer)(local_200 + 0x10);
    break;
  case StringList:
    local_108._0_8_ = local_200._0_8_;
    local_108._8_8_ = local_200._8_8_;
    local_108._16_8_ = local_200._16_8_;
    local_200._0_8_ = (pointer)0x0;
    local_200._8_8_ = (element_type *)0x0;
    local_200._16_8_ = (pointer)0x0;
  }
  local_158 = &local_148;
  local_130 = &local_120;
  Option(local_138,&local_98,&local_b8,(int)local_1e0,(value *)local_110);
  if (local_110._0_4_ == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
  }
  else if ((local_110._0_4_ == String) && ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)))
  {
    operator_delete((void *)local_108._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_208 == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_200);
  }
  else if ((local_208 == String) && ((pointer)local_200._0_8_ != (pointer)(local_200 + 0x10))) {
    operator_delete((void *)local_200._0_8_);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  return local_138;
}

Assistant:

Option Option::parse(std::string const& option_description)
{
	std::string shortOption, longOption;
	int argcount = 0;
	value val { false };
	
	auto double_space = option_description.find("  ");
	auto options_end = option_description.end();
	if (double_space != std::string::npos) {
		options_end = option_description.begin() + double_space;
	}
	
	static const std::regex pattern {"(--|-)?(.*?)([,= ]|$)"};
	for(std::sregex_iterator i {option_description.begin(), options_end, pattern, std::regex_constants::match_not_null},
	       e{};
	    i != e;
	    ++i)
	{
		std::smatch const& match = *i;
		if (match[1].matched) { // [1] is optional.
			if (match[1].length()==1) {
				shortOption = "-" + match[2].str();
			} else {
				longOption =  "--" + match[2].str();
			}
		} else if (match[2].length() > 0) { // [2] always matches.
			std::string m = match[2];
			argcount = 1;
		} else {
			// delimeter
		}

		if (match[3].length() == 0) { // [3] always matches.
			// Hit end of string. For some reason 'match_not_null' will let us match empty
			// at the end, and then we'll spin in an infinite loop. So, if we hit an empty
			// match, we know we must be at the end.
			break;
		}
	}

	if (argcount) {
		std::smatch match;
		if (std::regex_search(options_end, option_description.end(),
				      match,
				      std::regex{"\\[default: (.*)\\]", std::regex::icase}))
		{
			val = match[1].str();
		}
	}
	
	return {std::move(shortOption),
		std::move(longOption),
		argcount,
		std::move(val)};
}